

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O0

void __thiscall hdc::CppPrinter::visit(CppPrinter *this,LiteralIntegerExpression *expression)

{
  string *psVar1;
  Token local_48;
  LiteralIntegerExpression *local_18;
  LiteralIntegerExpression *expression_local;
  CppPrinter *this_local;
  
  this->isExpression = true;
  local_18 = expression;
  expression_local = (LiteralIntegerExpression *)this;
  LiteralExpression::get_token(&local_48,&expression->super_LiteralExpression);
  psVar1 = Token::getLexem_abi_cxx11_(&local_48);
  std::operator<<((ostream *)&this->field_0x20,(string *)psVar1);
  Token::~Token(&local_48);
  return;
}

Assistant:

void CppPrinter::visit(LiteralIntegerExpression* expression) {
    isExpression = true;
    output << expression->get_token().getLexem();
}